

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O1

uint strstrip(char *s)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  size_t sVar4;
  ushort **ppuVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  
  if (s == (char *)0x0) {
    uVar9 = 0;
  }
  else {
    sVar4 = strlen(s);
    ppuVar5 = __ctype_b_loc();
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      lVar7 = lVar6 + 1;
      if ((long)s[lVar6] == 0) break;
    } while (((*ppuVar5)[s[lVar6]] & 0x2000) != 0);
    pcVar1 = s + sVar4;
    sVar2 = (sVar4 - lVar7) + 2;
    uVar3 = ((int)sVar4 - (int)lVar7) + 1;
    do {
      uVar9 = uVar3;
      sVar4 = sVar2;
      pcVar8 = pcVar1;
      if (pcVar8 <= s + lVar6) break;
      pcVar1 = pcVar8 + -1;
      sVar2 = sVar4 - 1;
      uVar3 = uVar9 - 1;
    } while ((*(byte *)((long)*ppuVar5 + (long)pcVar8[-1] * 2 + 1) & 0x20) != 0);
    *pcVar8 = '\0';
    memmove(s,s + lVar6,sVar4);
  }
  return uVar9;
}

Assistant:

static unsigned strstrip(char * s)
{
    char *last = NULL ;
    char *dest = s;

    if (s == NULL) return 0;

    last = s + strlen(s);
    while (isspace((int)*s) && *s) s++;
    while (last > s) {
        if (!isspace((int) * (last - 1)))
            break ;
        last -- ;
    }
    *last = (char)0;

    memmove(dest, s, last - s + 1);
    return last - s;
}